

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiOutAlsa::closePort(MidiOutAlsa *this)

{
  undefined8 *puVar1;
  
  if ((this->super_MidiOutApi).super_MidiApi.connected_ == true) {
    puVar1 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
    snd_seq_unsubscribe_port(*puVar1,puVar1[2]);
    snd_seq_port_subscribe_free(puVar1[2]);
    puVar1[2] = 0;
    (this->super_MidiOutApi).super_MidiApi.connected_ = false;
  }
  return;
}

Assistant:

void MidiOutAlsa :: closePort( void )
{
  if ( connected_ ) {
    AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
    snd_seq_unsubscribe_port( data->seq, data->subscription );
    snd_seq_port_subscribe_free( data->subscription );
    data->subscription = 0;
    connected_ = false;
  }
}